

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

bool __thiscall
ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  uint uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  long *plVar4;
  SN_ELEMENT *pSVar5;
  long *plVar6;
  ulong uVar7;
  ON__UINT32 OVar8;
  bool bVar9;
  
  if (this->m_bHashTableIsValid != '\0') {
    uVar7 = this->m_active_id_count;
    OVar8 = blk->m_count;
    if (OVar8 << 7 < uVar7) {
      pSVar5 = blk->m_sn;
      uVar1 = this->m_hash_block_count;
      do {
        bVar9 = OVar8 == 0;
        OVar8 = OVar8 - 1;
        if (bVar9) {
          return true;
        }
        if (pSVar5->m_id_active != '\0') {
          plVar4 = (long *)((ulong)(uint)((int)(((ulong)pSVar5->m_id_crc32 / 0xffa) % 0xffa) << 3) +
                           (long)this->m_hash_table_blocks[(ulong)pSVar5->m_id_crc32 % (ulong)uVar1]
                           );
          puVar3 = (undefined1 *)0x0;
          plVar6 = plVar4;
          while (puVar2 = (undefined1 *)*plVar6, puVar2 != (undefined1 *)0x0) {
            if ((SN_ELEMENT *)puVar2 == pSVar5) {
              uVar7 = uVar7 - 1;
              this->m_active_id_count = uVar7;
              plVar6 = (long *)(puVar3 + 0x20);
              if (puVar3 == (undefined1 *)0x0) {
                plVar6 = plVar4;
              }
              *plVar6 = *(long *)(puVar2 + 0x20);
              break;
            }
            puVar3 = puVar2;
            plVar6 = (long *)(puVar2 + 0x20);
          }
        }
        pSVar5 = pSVar5 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ON_SerialNumberMap::Internal_HashTableRemoveSerialNumberBlock(const ON_SN_BLOCK* blk)
{
  // quickly remove every id in the block from the hash table.
  // This is done when the block is small compared to the
  // size of the hash table and removing the elements from
  // the hash table, rearranging the block, and then adding
  // the elements back into the hash table is faster than
  // simply rebuilding the hash table.
  //
  // The 128 multiplier is determined as follows:
  // - C = average number of elements with the same hash index
  //     = m_active_id_count/m_hash_capacity.
  // - D = cost of destroying hash table = time to memset the table
  //       to zero.
  // - H = cost of calculating the hash table index of an id.
  // - A = The cost of adding an element to the hash table is
  //       H + two pointer assignments with is essentially H.
  // - F = The average cost of finding an element in the hash
  //       table is H plus going through half the linked list
  //       of elements at that hash index (C/2 pointer dereferences).
  // - B = number of elements in a block.
  // - I = (number times a valid hash table is destroyed)/
  //       (number of times the hash table is rebuilt).
  // - R = rebuild cost = A*m_active_id_count.
  // - Keeping the the has table up to date only makes sense if
  //   R > I*(A+F)*active_id_count
  //   it is needed often enough to justify ...
  bool rc = false;
  if ( m_bHashTableIsValid && m_active_id_count > 128*blk->m_count )
  {
    const SN_ELEMENT* e;
    struct SN_ELEMENT** hash_table_block;
    SN_ELEMENT* h;
    SN_ELEMENT* prev;
    ON__UINT32 i;
    rc = true;
    for (e = blk->m_sn, i = blk->m_count; i--; e++)
    {
      if ( 0 == e->m_id_active )
        continue;
      hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
      ON__UINT32 hash_i = Internal_HashTableBlockRowIndex(e->m_id_crc32);
      prev = 0;
      for ( h = hash_table_block[hash_i]; nullptr !=  h; h = h->m_next )
      {
        if (h == e)
        {
          // Do not change value of SN_ELEMENT's m_id_active.
          // This value is needed by AddBlockToHashTableHelper()
          // when it add the element back in.
          m_active_id_count--;
          if (prev)
            prev->m_next = h->m_next;
          else
            hash_table_block[hash_i] = h->m_next;
          break;
        }
        prev = h;
      }
    }
  }
  return rc;
}